

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O3

QList<QSslCipher> * QSslSocketPrivate::supportedCiphers(void)

{
  __pointer_type pQVar1;
  Type *pTVar2;
  Type *pTVar3;
  Type *in_RDI;
  bool bVar4;
  
  pTVar3 = in_RDI;
  ensureInitialized();
  pTVar2 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>::
           operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>
                       *)pTVar3);
  if (pTVar2 != (Type *)0x0) {
    if ((pTVar2->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
      LOCK();
      bVar4 = (pTVar2->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
      if (bVar4) {
        (pTVar2->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
      }
      UNLOCK();
      if (bVar4) goto LAB_0016e115;
    }
    pTVar3 = pTVar2;
    QBasicMutex::lockInternal();
  }
LAB_0016e115:
  pTVar3 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>::
           operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>
                       *)pTVar3);
  pQVar1 = (__pointer_type)(pTVar3->supportedCiphers).d.d;
  (in_RDI->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = pQVar1;
  (in_RDI->supportedCiphers).d.d = (Data *)(pTVar3->supportedCiphers).d.ptr;
  (in_RDI->supportedCiphers).d.ptr = (QSslCipher *)(pTVar3->supportedCiphers).d.size;
  if (pQVar1 != (__pointer_type)0x0) {
    LOCK();
    *(int *)pQVar1 = *(int *)pQVar1 + 1;
    UNLOCK();
  }
  if (pTVar2 != (Type *)0x0) {
    LOCK();
    pQVar1 = (pTVar2->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p;
    (pTVar2->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
    if (pQVar1 != (__pointer_type)0x1) {
      QBasicMutex::unlockInternalFutex(pTVar2);
    }
  }
  return (QList<QSslCipher> *)in_RDI;
}

Assistant:

QList<QSslCipher> QSslSocketPrivate::supportedCiphers()
{
    QSslSocketPrivate::ensureInitialized();
    QMutexLocker locker(&globalData()->mutex);
    return globalData()->supportedCiphers;
}